

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.cpp
# Opt level: O0

void YCbCrToRGBMCU(Header *header,MCU *mcu,MCU *cbcr,uint v,uint h)

{
  uint uVar1;
  uint uVar2;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int b;
  int g;
  int r;
  uint cbcrPixel;
  uint cbcrPixelColumn;
  uint cbcrPixelRow;
  uint pixel;
  uint x;
  uint y;
  uint h_local;
  uint v_local;
  MCU *cbcr_local;
  MCU *mcu_local;
  Header *header_local;
  
  for (pixel = 7; pixel < 8; pixel = pixel - 1) {
    for (cbcrPixelRow = 7; cbcrPixelRow < 8; cbcrPixelRow = cbcrPixelRow - 1) {
      uVar1 = pixel * 8 + cbcrPixelRow;
      uVar2 = (pixel / header->verticalSamplingFactor + v * 4) * 8 +
              cbcrPixelRow / header->horizontalSamplingFactor + h * 4;
      local_50 = (int)((float)*(int *)((long)&cbcr->field_2 + (ulong)uVar2 * 4) * 1.402 +
                       (float)(mcu->field_0).y[uVar1] + 128.0);
      local_58 = (int)((float)*(int *)((long)&cbcr->field_2 + (ulong)uVar2 * 4) * -0.714 +
                       (float)*(int *)((long)&cbcr->field_1 + (ulong)uVar2 * 4) * -0.344 +
                       (float)(mcu->field_0).y[uVar1] + 128.0);
      local_60 = (int)((float)*(int *)((long)&cbcr->field_1 + (ulong)uVar2 * 4) * 1.772 +
                       (float)(mcu->field_0).y[uVar1] + 128.0);
      if (local_50 < 0) {
        local_50 = 0;
      }
      if (local_50 < 0x100) {
        local_54 = local_50;
      }
      else {
        local_54 = 0xff;
      }
      if (local_58 < 0) {
        local_58 = 0;
      }
      if (local_58 < 0x100) {
        local_5c = local_58;
      }
      else {
        local_5c = 0xff;
      }
      if (local_60 < 0) {
        local_60 = 0;
      }
      if (local_60 < 0x100) {
        local_64 = local_60;
      }
      else {
        local_64 = 0xff;
      }
      (mcu->field_0).y[uVar1] = local_54;
      *(int *)((long)&mcu->field_1 + (ulong)uVar1 * 4) = local_5c;
      *(int *)((long)&mcu->field_2 + (ulong)uVar1 * 4) = local_64;
    }
  }
  return;
}

Assistant:

void YCbCrToRGBMCU(const Header* const header, MCU& mcu, const MCU& cbcr, const uint v, const uint h) {
	//从bottom-right to top-left
	for (uint y = 7; y < 8; y--) {
		for (uint x = 7; x < 8; x--) {
			//chroma 分量用了第一个block的
			//luminance 分量不变
			const uint pixel = y * 8 + x;
			const uint cbcrPixelRow = y / header->verticalSamplingFactor + 4 * v;
			const uint cbcrPixelColumn = x / header->horizontalSamplingFactor + 4 * h;
			const uint cbcrPixel = cbcrPixelRow * 8 + cbcrPixelColumn;
			int r = mcu.y[pixel]  						       + 1.402f * cbcr.cr[cbcrPixel] + 128;
			int g = mcu.y[pixel] - 0.344f * cbcr.cb[cbcrPixel] - 0.714f * cbcr.cr[cbcrPixel] + 128;
			int b = mcu.y[pixel] + 1.772f * cbcr.cb[cbcrPixel] 							     + 128;
			r = r < 0 ? 0 : r;
			r = r > 255 ? 255 : r;
			g = g < 0 ? 0 : g;
			g = g > 255 ? 255 : g;
			b = b < 0 ? 0 : b;
			b = b > 255 ? 255 : b;
			mcu.r[pixel] = r;
			mcu.g[pixel] = g;
			mcu.b[pixel] = b;
		}
	}
	

}